

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O1

bool __thiscall DReachabilityPropagator::remove_deg1(DReachabilityPropagator *this,int u)

{
  anon_union_8_2_743a5d44_for_Reason_0 aVar1;
  char cVar2;
  pointer pvVar3;
  uint *puVar4;
  bool bVar5;
  BoolView *pBVar6;
  undefined4 uVar7;
  int iVar8;
  BoolView *pBVar9;
  BoolView *extraout_RAX;
  anon_union_8_2_743a5d44_for_Reason_0 aVar10;
  pointer piVar11;
  uint uVar12;
  DReachabilityPropagator *pDVar13;
  uint *puVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  undefined8 unaff_RBP;
  anon_union_8_2_743a5d44_for_Reason_0 *elem;
  Lit *elem_00;
  size_t sVar18;
  int *pt;
  ulong uVar19;
  int *pt_2;
  int *pt_1;
  bool bVar20;
  Clause *c;
  int last_seen;
  int oe;
  vec<Lit> ps_out;
  Clause *expl;
  uint local_8c;
  anon_union_8_2_743a5d44_for_Reason_0 local_88;
  undefined8 uStack_80;
  Clause *local_78;
  uint local_70;
  uint local_6c;
  vec<Lit> local_68;
  vec<Lit> local_58;
  vec<TrailElem> *local_40;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_38;
  
  uVar17 = (uint)unaff_RBP;
  pBVar9 = (this->super_GraphPropagator).vs.data;
  if (sat.assigns.data[(uint)pBVar9[(uint)u].v] != '\0') {
    uVar19 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    uVar17 = (uint)uVar19;
    if ((uint)pBVar9[(uint)u].s * 2 + -1 == (int)sat.assigns.data[(uint)pBVar9[(uint)u].v])
    goto LAB_001cf331;
  }
  local_8c = u;
  if ((this->root == u) && (1 < this->in_nodes_size)) {
    local_78 = (Clause *)CONCAT44(local_78._4_4_,0xffffffff);
    local_68.sz = 0;
    local_68.cap = 0;
    local_68.data = (Lit *)0x0;
    if (so.lazy) {
      vec<Lit>::push(&local_68);
    }
    pvVar3 = (this->ou).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar14 = *(uint **)&pvVar3[this->root].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data;
    puVar4 = (uint *)pvVar3[this->root].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    uVar19 = 0;
    if (puVar14 != puVar4) {
      do {
        uVar17 = *puVar14;
        pBVar9 = (this->super_GraphPropagator).es.data;
        if ((sat.assigns.data[(uint)pBVar9[uVar17].v] == '\0') ||
           ((uint)pBVar9[uVar17].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar9[uVar17].v])) {
          uVar19 = (ulong)((int)uVar19 + 1);
          local_78 = (Clause *)CONCAT44(local_78._4_4_,uVar17);
        }
        else if (so.lazy == true) {
          local_88._a._0_4_ =
               (uint)((int)sat.assigns.data[(uint)pBVar9[uVar17].v] - 1U < 0xfffffffd) +
               pBVar9[uVar17].v * 2;
          vec<Lit>::push(&local_68,(Lit *)&local_88);
        }
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar4);
      uVar19 = CONCAT71((int7)(uVar19 >> 8),(int)uVar19 == 1);
    }
    bVar20 = true;
    if ((((char)uVar19 != '\0') && (1 < this->in_nodes_size)) &&
       (sat.assigns.data
        [(uint)(this->super_GraphPropagator).es.data[(ulong)local_78 & 0xffffffff].v] == '\0')) {
      if (so.lazy == true) {
        puVar14 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
        puVar4 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_finish;
        pDVar13 = this;
        if (puVar14 == puVar4) {
          uVar19 = 0xffffffff;
        }
        else {
          do {
            uVar17 = *puVar14;
            pDVar13 = (DReachabilityPropagator *)((ulong)pDVar13 & 0xffffffff);
            if (uVar17 != local_8c) {
              pDVar13 = (DReachabilityPropagator *)(ulong)uVar17;
            }
            uVar12 = (uint)pDVar13;
            if (uVar17 != local_8c) goto LAB_001cec8d;
            puVar14 = puVar14 + 1;
          } while (puVar14 != puVar4);
          uVar12 = 0xffffffff;
LAB_001cec8d:
          uVar19 = (ulong)uVar12;
        }
        uVar17 = (this->super_GraphPropagator).vs.data[(uint)this->root].v;
        local_88._a._0_4_ = (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) + uVar17 * 2;
        vec<Lit>::push(&local_68,(Lit *)&local_88);
        uVar17 = (this->super_GraphPropagator).vs.data[uVar19].v;
        local_88._a._0_4_ = (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) + uVar17 * 2;
        vec<Lit>::push(&local_68,(Lit *)&local_88);
        uVar17 = local_68.sz;
        uVar19 = local_68._0_8_ & 0xffffffff;
        sVar18 = 8;
        if (local_68.sz != 0) {
          sVar18 = (ulong)(local_68.sz - 1) * 4 + 8;
        }
        local_88._pt = (Clause *)malloc(sVar18);
        uVar12 = *(uint *)local_88._pt;
        (local_88._pt)->data[0].x = -2;
        *(uint *)local_88._pt = uVar12 & 0xfc | uVar17 << 8;
        if (uVar17 != 0) {
          uVar16 = 0;
          do {
            (local_88._pt)->data[uVar16].x = local_68.data[uVar16].x;
            uVar16 = uVar16 + 1;
          } while (uVar19 != uVar16);
        }
        *(byte *)local_88._pt = *(byte *)local_88._pt | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_88._pt);
        aVar10 = local_88;
      }
      else {
        aVar10._pt = (Clause *)0x0;
      }
      pBVar9 = (this->super_GraphPropagator).es.data;
      SAT::cEnqueue(&sat,(Lit)((uint)pBVar9[(ulong)local_78 & 0xffffffff].s +
                              pBVar9[(ulong)local_78 & 0xffffffff].v * 2),(Reason)aVar10);
      iVar8 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x11])
                        (this,(ulong)local_78 & 0xffffffff);
      if ((char)iVar8 == '\0') {
LAB_001cf5c0:
        bVar20 = false;
        uVar19 = 0;
      }
      else {
        aVar1._pt = (Clause *)(this->last_state_e + local_78._0_4_);
        uStack_80 = (void *)CONCAT44(4,*(uint *)aVar1._pt);
        local_88._pt = aVar1._pt;
        vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_88);
        *(uint *)aVar1._pt = 0;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &this->new_edge,(int *)&local_78);
        pBVar9 = (this->super_GraphPropagator).vs.data;
        uVar17 = *(uint *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[local_78._0_4_].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data + 4);
        if (sat.assigns.data[(uint)pBVar9[uVar17].v] == '\0') {
          if (so.lazy == true) {
            local_88._pt = (Clause *)0x0;
            uStack_80 = (void *)0x0;
            vec<Lit>::push((vec<Lit> *)&local_88);
            uVar17 = (this->super_GraphPropagator).es.data[(ulong)local_78 & 0xffffffff].v;
            local_58.sz = (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) + uVar17 * 2;
            vec<Lit>::push((vec<Lit> *)&local_88,(Lit *)&local_58);
            aVar10._pt = Reason_new<vec<Lit>>((vec<Lit> *)&local_88);
            if (uStack_80 != (void *)0x0) {
              free(uStack_80);
            }
          }
          pBVar9 = (this->super_GraphPropagator).vs.data;
          uVar17 = *(uint *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[local_78._0_4_].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + 4);
          SAT::cEnqueue(&sat,(Lit)((uint)pBVar9[uVar17].s + pBVar9[uVar17].v * 2),(Reason)aVar10);
          aVar10._pt = (Clause *)
                       (this->last_state_n +
                       *(int *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[local_78._0_4_].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + 4));
          uStack_80 = (void *)CONCAT44(4,*(int *)aVar10._pt);
          local_88._pt = aVar10._pt;
          vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_88);
          *(int *)aVar10._pt = 0;
          add_innode(this,*(int *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start
                                             [local_78._0_4_].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data + 4));
          local_88._a._0_4_ =
               *(undefined4 *)
                (*(long *)&(this->super_GraphPropagator).endnodes.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_78._0_4_].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 4);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _M_insert_unique<int>(&(this->new_node)._M_t,(int *)&local_88._a);
        }
        else if ((uint)pBVar9[uVar17].s * 2 + -1 == (int)sat.assigns.data[(uint)pBVar9[uVar17].v]) {
          if (so.lazy == true) {
            local_88._pt = (Clause *)0x0;
            uStack_80 = (void *)0x0;
            uVar17 = (this->super_GraphPropagator).es.data[(ulong)local_78 & 0xffffffff].v;
            elem_00 = (Lit *)&local_58;
            local_58.sz = (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) + uVar17 * 2;
            vec<Lit>::push((vec<Lit> *)&local_88,elem_00);
            local_58._0_8_ = Clause_new<vec<Lit>>((vec<Lit> *)&local_88,SUB81(elem_00,0));
            *(byte *)local_58._0_8_ = *(byte *)local_58._0_8_ | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_58);
            sat.confl = (Clause *)local_58._0_8_;
            if (uStack_80 != (void *)0x0) {
              free(uStack_80);
            }
          }
          goto LAB_001cf5c0;
        }
        uVar19 = CONCAT71((int7)((ulong)&local_78 >> 8),1);
        bVar20 = false;
      }
    }
    uVar17 = (uint)uVar19;
    if (local_68.data != (Lit *)0x0) {
      free(local_68.data);
    }
    if (!bVar20) goto LAB_001cf331;
  }
  if (local_8c != this->root) {
    local_68.sz = 0;
    local_68.cap = 0;
    local_68.data = (Lit *)0x0;
    local_58._0_8_ = (Clause *)0x0;
    local_58.data = (Lit *)0x0;
    local_70 = uVar17;
    if (so.lazy == true) {
      vec<Lit>::push(&local_68);
    }
    pvVar3 = (this->in).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar14 = *(uint **)&pvVar3[(int)local_8c].super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data;
    puVar4 = (uint *)pvVar3[(int)local_8c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    if (puVar14 == puVar4) {
LAB_001cedd7:
      uVar19 = (ulong)local_8c;
      pBVar9 = (this->super_GraphPropagator).vs.data;
      cVar2 = sat.assigns.data[(uint)pBVar9[uVar19].v];
      if (cVar2 == '\0') {
LAB_001ceed8:
        if (so.lazy == true) {
          local_88._a._0_4_ =
               (uint)((int)sat.assigns.data[(uint)pBVar9[(uint)this->root].v] - 1U < 0xfffffffd) +
               pBVar9[(uint)this->root].v * 2;
          vec<Lit>::push(&local_68,(Lit *)&local_88);
          uVar17 = local_68.sz;
          uVar19 = local_68._0_8_ & 0xffffffff;
          sVar18 = 8;
          if (local_68.sz != 0) {
            sVar18 = (ulong)(local_68.sz - 1) * 4 + 8;
          }
          local_88._pt = (Clause *)malloc(sVar18);
          uVar12 = *(uint *)local_88._pt;
          (local_88._pt)->data[0].x = -2;
          *(uint *)local_88._pt = uVar12 & 0xfc | uVar17 << 8;
          if (uVar17 != 0) {
            uVar16 = 0;
            do {
              (local_88._pt)->data[uVar16].x = local_68.data[uVar16].x;
              uVar16 = uVar16 + 1;
            } while (uVar19 != uVar16);
          }
          *(byte *)local_88._pt = *(byte *)local_88._pt | 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_88._pt);
          aVar10 = local_88;
        }
        else {
          aVar10._pt = (Clause *)0x0;
        }
        pBVar9 = (this->super_GraphPropagator).vs.data;
        SAT::cEnqueue(&sat,(Lit)((pBVar9[local_8c].s ^ 1) + pBVar9[local_8c].v * 2),(Reason)aVar10);
        iVar8 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x13])
                          (this,(ulong)local_8c);
        if ((char)iVar8 != '\0') {
          aVar1._pt = (Clause *)(this->last_state_n + (int)local_8c);
          uStack_80 = (void *)CONCAT44(4,*(uint *)aVar1._pt);
          local_88._pt = aVar1._pt;
          vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_88);
          *(uint *)aVar1._pt = 1;
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->rem_node,(int *)&local_8c);
          if (so.lazy == true) {
            local_88._pt = (Clause *)0x0;
            uStack_80 = (void *)0x0;
            vec<Lit>::push((vec<Lit> *)&local_88);
            uVar17 = (this->super_GraphPropagator).vs.data[local_8c].v;
            local_78 = (Clause *)
                       CONCAT44(local_78._4_4_,
                                (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) + uVar17 * 2
                               );
            vec<Lit>::push((vec<Lit> *)&local_88,(Lit *)&local_78);
            aVar10._pt = Reason_new<vec<Lit>>((vec<Lit> *)&local_88);
            if (uStack_80 != (void *)0x0) {
              free(uStack_80);
            }
          }
          pvVar3 = (this->ou).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar11 = pvVar3[(int)local_8c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          bVar20 = pvVar3[(int)local_8c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish == piVar11;
          if (!bVar20) {
            local_38 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &this->rem_edge;
            uVar19 = 0;
            local_40 = &engine.trail;
            do {
              local_6c = piVar11[uVar19];
              iVar8 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0xe])
                                (this,(ulong)*(uint *)(*(long *)&(this->super_GraphPropagator).
                                                                 endnodes.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)local_6c].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 4));
              if ((char)iVar8 == '\0') {
LAB_001cf24f:
                bVar5 = false;
                local_70 = 0;
              }
              else {
                uVar16 = (ulong)local_6c;
                pBVar9 = (this->super_GraphPropagator).es.data;
                if (sat.assigns.data[(uint)pBVar9[uVar16].v] == '\0') {
                  SAT::cEnqueue(&sat,(Lit)((pBVar9[uVar16].s ^ 1) + pBVar9[uVar16].v * 2),
                                (Reason)aVar10);
                  aVar1._pt = (Clause *)(this->last_state_e + (int)local_6c);
                  uStack_80 = (void *)CONCAT44(4,*(uint *)aVar1._pt);
                  local_88._pt = aVar1._pt;
                  vec<TrailElem>::push(local_40,(TrailElem *)&local_88);
                  *(uint *)aVar1._pt = 1;
                  bVar5 = true;
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>(local_38,(int *)&local_6c);
                }
                else {
                  bVar5 = true;
                  if ((uint)pBVar9[uVar16].s * -2 + 1 ==
                      (int)sat.assigns.data[(uint)pBVar9[uVar16].v]) {
                    if (so.lazy == true) {
                      local_88._pt = (Clause *)0x0;
                      uStack_80 = (void *)0x0;
                      uVar17 = (this->super_GraphPropagator).vs.data[local_8c].v;
                      local_78 = (Clause *)
                                 CONCAT44(local_78._4_4_,
                                          (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) +
                                          uVar17 * 2);
                      vec<Lit>::push((vec<Lit> *)&local_88,(Lit *)&local_78);
                      uVar7 = local_88._a._0_4_;
                      uVar16 = local_88._a & 0xffffffff;
                      sVar18 = (ulong)(local_88._a._0_4_ - 1) * 4 + 8;
                      if (local_88._a._0_4_ == 0) {
                        sVar18 = 8;
                      }
                      local_78 = (Clause *)malloc(sVar18);
                      uVar17 = *(uint *)local_78;
                      local_78->data[0].x = -2;
                      *(uint *)local_78 = uVar17 & 0xfc | uVar7 << 8;
                      if (uVar7 != 0) {
                        uVar15 = 0;
                        do {
                          local_78->data[uVar15].x = *(int *)((long)uStack_80 + uVar15 * 4);
                          uVar15 = uVar15 + 1;
                        } while (uVar16 != uVar15);
                      }
                      *(byte *)local_78 = *(byte *)local_78 | 2;
                      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_78);
                      sat.confl = local_78;
                      if (uStack_80 != (void *)0x0) {
                        free(uStack_80);
                      }
                    }
                    goto LAB_001cf24f;
                  }
                }
              }
              if (!bVar5) break;
              uVar19 = (ulong)((int)uVar19 + 1);
              pvVar3 = (this->ou).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              piVar11 = pvVar3[(int)local_8c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar16 = (long)pvVar3[(int)local_8c].super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)piVar11 >> 2;
              bVar20 = uVar16 <= uVar19;
            } while (uVar19 < uVar16);
          }
          goto LAB_001cf306;
        }
      }
      else {
        if ((uint)pBVar9[uVar19].s * -2 + 1 != (int)cVar2) {
          bVar20 = true;
          if (cVar2 != '\0') goto LAB_001cf306;
          goto LAB_001ceed8;
        }
        if (so.lazy == true) {
          local_88._a._0_4_ =
               (uint)((int)sat.assigns.data[(uint)pBVar9[uVar19].v] - 1U < 0xfffffffd) +
               pBVar9[uVar19].v * 2;
          vec<Lit>::push(&local_58,(Lit *)&local_88);
          uVar17 = (this->super_GraphPropagator).vs.data[(uint)this->root].v;
          local_88._a._0_4_ = (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) + uVar17 * 2;
          elem = &local_88;
          vec<Lit>::push(&local_58,(Lit *)elem);
          local_88._pt = Clause_new<vec<Lit>>(&local_58,SUB81(elem,0));
          *(byte *)local_88._pt = *(byte *)local_88._pt | 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_88._pt);
          sat.confl = local_88._pt;
        }
      }
      bVar20 = false;
      local_70 = 0;
    }
    else {
      iVar8 = 0;
      do {
        uVar17 = *puVar14;
        pBVar9 = (this->super_GraphPropagator).es.data;
        pBVar6 = pBVar9 + uVar17;
        if ((sat.assigns.data[(uint)pBVar6->v] == '\0') ||
           (pBVar9 = pBVar9 + uVar17,
           (uint)pBVar9->s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar6->v])) {
          iVar8 = iVar8 + 1;
        }
        else if (so.lazy == true) {
          local_88._a._0_4_ =
               (uint)((int)sat.assigns.data[(uint)pBVar9->v] - 1U < 0xfffffffd) + pBVar9->v * 2;
          vec<Lit>::push(&local_68,(Lit *)&local_88);
          uVar17 = (this->super_GraphPropagator).es.data[uVar17].v;
          local_88._a._0_4_ = (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) + uVar17 * 2;
          vec<Lit>::push(&local_58,(Lit *)&local_88);
          pBVar9 = extraout_RAX;
        }
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar4);
      if (iVar8 < 1) goto LAB_001cedd7;
      local_70 = (uint)CONCAT71((int7)((ulong)pBVar9 >> 8),1);
      bVar20 = false;
    }
LAB_001cf306:
    if (local_58.data != (Lit *)0x0) {
      free(local_58.data);
    }
    if (local_68.data != (Lit *)0x0) {
      free(local_68.data);
    }
    uVar19 = (ulong)local_70;
    if (!bVar20) goto LAB_001cf331;
  }
  uVar19 = 1;
LAB_001cf331:
  return (bool)((byte)uVar19 & 1);
}

Assistant:

bool DReachabilityPropagator::remove_deg1(int u) {
	if (DEBUG) {
		std::cout << "Remove deg1 from " << u << '\n';
	}
	if (getNodeVar(u).isFixed() && getNodeVar(u).isFalse()) {
		return true;
	}

	if (u == get_root_idx() && in_nodes_size > 1) {
		Clause* r = nullptr;
		int out_deg = 0;
		int last_seen = -1;
		vec<Lit> ps_out;
		if (so.lazy) {
			ps_out.push();
		}
		for (const int oe : ou[get_root_idx()]) {
			if (!getEdgeVar(oe).isFixed() || getEdgeVar(oe).isTrue()) {
				out_deg++;
				last_seen = oe;
			} else if (so.lazy) {
				ps_out.push(getEdgeVar(oe).getValLit());
			}
		}
		if (out_deg == 1 && in_nodes_size > 1 && !getEdgeVar(last_seen).isFixed()) {
			if (so.lazy) {
				const int other = get_some_innode_not(u);
				assert(other != -1);
				ps_out.push(getNodeVar(get_root_idx()).getValLit());
				ps_out.push(getNodeVar(other).getValLit());
				r = Reason_new(ps_out);
			}
			getEdgeVar(last_seen).setVal(true, r);
			if (!propagateNewEdge(last_seen)) {
				return false;
			}
			last_state_e[last_seen] = VT_IN;
			new_edge.insert(last_seen);
			if (DEBUG) {
				std::cout << "Edge in " << last_seen << '\n';
			}
			// Propagate New Edge already does this.
			// We enforce the other extremity if not there yet:
			//*
			if (!getNodeVar(getHead(last_seen)).isFixed()) {
				if (so.lazy) {
					vec<Lit> ps;
					ps.push();
					ps.push(getEdgeVar(last_seen).getValLit());
					r = Reason_new(ps);
				}
				getNodeVar(getHead(last_seen)).setVal(true, r);
				last_state_n[getHead(last_seen)] = VT_IN;
				add_innode(getHead(last_seen));
				new_node.insert(getHead(last_seen));
				if (DEBUG) {
					std::cout << "Node in " << getHead(last_seen) << '\n';
				}
			} else if (getNodeVar(getHead(last_seen)).isFalse()) {
				if (so.lazy) {
					vec<Lit> psfail;
					psfail.push(getEdgeVar(last_seen).getValLit());
					Clause* expl = Clause_new(psfail);
					expl->temp_expl = 1;
					sat.rtrail.last().push(expl);
					sat.confl = expl;
				}
				if (DEBUG) {
					std::cout << "False " << __FILE__ << __LINE__ << '\n';
				}
				return false;
			}  //*/

			return true;
		}
	}

	if (u != get_root_idx()) {
		int in_deg = 0;
		vec<Lit> ps_in;
		vec<Lit> ps_in_fail;
		if (so.lazy) {
			ps_in.push();
		}

		for (const int ie : in[u]) {
			if (!getEdgeVar(ie).isFixed() || getEdgeVar(ie).isTrue()) {
				in_deg++;
			} else if (so.lazy) {
				ps_in.push(getEdgeVar(ie).getValLit());
				ps_in_fail.push(getEdgeVar(ie).getValLit());
			}
		}

		if (in_deg > 0) {
			return true;
		}

		if (getNodeVar(u).isFixed() && getNodeVar(u).isTrue()) {
			// Fail because no way to get to this node
			if (so.lazy) {
				ps_in_fail.push(getNodeVar(u).getValLit());
				ps_in_fail.push(getNodeVar(get_root_idx()).getValLit());
				Clause* expl = Clause_new(ps_in_fail);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			if (DEBUG) {
				std::cout << "False " << u << " " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		Clause* r = nullptr;
		if (!getNodeVar(u).isFixed()) {
			// Force the node to be out.
			if (so.lazy) {
				ps_in.push(getNodeVar(get_root_idx()).getValLit());
				r = Reason_new(ps_in);
			}
			getNodeVar(u).setVal(false, r);
			if (!propagateRemNode(u)) {
				return false;
			}
			last_state_n[u] = VT_OUT;
			rem_node.insert(u);
			if (DEBUG) {
				std::cout << "Node out " << u << '\n';
			}
			//*
			if (so.lazy) {
				vec<Lit> ps;
				ps.push();
				ps.push(getNodeVar(u).getValLit());
				r = Reason_new(ps);
			}  //*/
			for (unsigned int i = 0; i < ou[u].size(); i++) {
				const int oe = ou[u][i];
				if (!remove_deg1(getHead(oe))) {
					if (DEBUG) {
						std::cout << "False " << __FILE__ << __LINE__ << '\n';
					}
					return false;
				}
				// Done by PropagateRemNode
				//*
				if (!getEdgeVar(oe).isFixed()) {
					getEdgeVar(oe).setVal(false, r);
					last_state_e[oe] = VT_OUT;
					rem_edge.insert(oe);
					if (DEBUG) {
						std::cout << "Edge out " << oe << '\n';
					}

				} else if (getEdgeVar(oe).isTrue()) {
					if (so.lazy) {
						vec<Lit> psfail;
						psfail.push(getNodeVar(u).getValLit());
						Clause* expl = Clause_new(psfail);
						expl->temp_expl = 1;
						sat.rtrail.last().push(expl);
						sat.confl = expl;
					}
					if (DEBUG) {
						std::cout << "False " << __FILE__ << __LINE__ << '\n';
					}
					return false;
				}  //*/
			}
		}
	}

	return true;
}